

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_taproot(void)

{
  int iVar1;
  uchar sig [64];
  uchar msg [32];
  int pk_parity;
  uchar tweak [32];
  uchar output_pk_bytes [32];
  secp256k1_xonly_pubkey output_pk;
  uchar internal_pk_bytes [32];
  secp256k1_xonly_pubkey internal_pk;
  secp256k1_keypair keypair;
  uchar sk [32];
  uchar *in_stack_fffffffffffffe30;
  secp256k1_keypair *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  uchar *in_stack_fffffffffffffe48;
  secp256k1_context *in_stack_fffffffffffffe50;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe88;
  secp256k1_keypair *in_stack_fffffffffffffe90;
  secp256k1_context *in_stack_fffffffffffffe98;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffea0;
  secp256k1_context *in_stack_fffffffffffffea8;
  uchar *in_stack_fffffffffffffeb8;
  secp256k1_keypair *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  uchar *in_stack_fffffffffffffed0;
  secp256k1_context *in_stack_fffffffffffffed8;
  
  testrand256(in_stack_fffffffffffffe30);
  iVar1 = secp256k1_keypair_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b2,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (int *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b3,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90->data,
                     in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b5,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, tweak, &internal_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b6,
            "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (int *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b7,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90->data,
                     in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3b8,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, output_pk_bytes, &output_pk) == 1"
           );
    abort();
  }
  testrand256(in_stack_fffffffffffffe30);
  iVar1 = secp256k1_schnorrsig_sign32
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3bc,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_parse
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3be,
            "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &output_pk, output_pk_bytes) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_schnorrsig_verify
                    ((secp256k1_context *)output_pk.data._56_8_,(uchar *)output_pk.data._48_8_,
                     (uchar *)output_pk.data._40_8_,output_pk.data._32_8_,
                     (secp256k1_xonly_pubkey *)output_pk.data._24_8_);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3bf,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &output_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90->data,
                     in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3c2,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, internal_pk_bytes, &internal_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_parse
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3c4,
            "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &internal_pk, internal_pk_bytes) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x3c5,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk_bytes, pk_parity, &internal_pk, tweak) == 1"
           );
    abort();
  }
  return;
}

Assistant:

static void test_schnorrsig_taproot(void) {
    unsigned char sk[32];
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey internal_pk;
    unsigned char internal_pk_bytes[32];
    secp256k1_xonly_pubkey output_pk;
    unsigned char output_pk_bytes[32];
    unsigned char tweak[32];
    int pk_parity;
    unsigned char msg[32];
    unsigned char sig[64];

    /* Create output key */
    testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1);
    /* In actual taproot the tweak would be hash of internal_pk */
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, tweak, &internal_pk) == 1);
    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, output_pk_bytes, &output_pk) == 1);

    /* Key spend */
    testrand256(msg);
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1);
    /* Verify key spend */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &output_pk, output_pk_bytes) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &output_pk) == 1);

    /* Script spend */
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, internal_pk_bytes, &internal_pk) == 1);
    /* Verify script spend */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &internal_pk, internal_pk_bytes) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk_bytes, pk_parity, &internal_pk, tweak) == 1);
}